

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_generic.c
# Opt level: O1

void gf_25519_sub(gf_25519_s *d,gf_25519_s *a,gf_25519_s *b)

{
  ulong uVar1;
  word_t wVar2;
  ulong uVar3;
  ulong uVar4;
  uint i;
  long lVar5;
  ulong uVar6;
  
  lVar5 = 0;
  do {
    d->limb[lVar5] = a->limb[lVar5] - b->limb[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  uVar6 = d->limb[0] + 0x1fffffffffffb4;
  d->limb[0] = uVar6;
  lVar5 = 1;
  do {
    wVar2 = (d->limb + lVar5)[1];
    d->limb[lVar5] = d->limb[lVar5] + 0x1ffffffffffffc;
    (d->limb + lVar5)[1] = wVar2 + 0x1ffffffffffffc;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 5);
  uVar1 = d->limb[4];
  lVar5 = 2;
  do {
    uVar3 = (d->limb + lVar5)[1];
    uVar4 = (d->limb + lVar5 + 1)[1];
    d->limb[lVar5 + 1] = (d->limb[lVar5] >> 0x33) + (d->limb[lVar5 + 1] & 0x7ffffffffffff);
    (d->limb + lVar5 + 1)[1] = (uVar3 >> 0x33) + (uVar4 & 0x7ffffffffffff);
    lVar5 = lVar5 + -2;
  } while (lVar5 != -2);
  d->limb[0] = (uVar1 >> 0x33) * 0x13 + (uVar6 & 0x7ffffffffffff);
  return;
}

Assistant:

void gf_sub (gf d, const gf a, const gf b) {
    gf_sub_RAW ( d, a, b );
    gf_bias( d, 2 );
    gf_weak_reduce ( d );
}